

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O3

ssize_t __thiscall phosg::BitWriter::write(BitWriter *this,int __fd,void *__buf,size_t __n)

{
  byte *pbVar1;
  uint uVar2;
  ulong in_RAX;
  ulong extraout_RAX;
  byte bVar3;
  
  if (this->last_byte_unset_bits == '\0') {
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (&this->data,((byte)__fd ^ 1) * -0x80 + -0x80);
    this->last_byte_unset_bits = '\a';
    in_RAX = extraout_RAX;
  }
  else {
    bVar3 = this->last_byte_unset_bits - 1;
    this->last_byte_unset_bits = bVar3;
    if ((byte)__fd != 0) {
      uVar2 = 1 << (bVar3 & 0x1f);
      in_RAX = (ulong)uVar2;
      pbVar1 = (byte *)((this->data)._M_dataplus._M_p + ((this->data)._M_string_length - 1));
      *pbVar1 = *pbVar1 | (byte)uVar2;
    }
  }
  return in_RAX;
}

Assistant:

void BitWriter::write(bool v) {
  if (this->last_byte_unset_bits > 0) {
    this->last_byte_unset_bits--;
    if (v) {
      this->data[this->data.size() - 1] |= (1 << this->last_byte_unset_bits);
    }
  } else {
    this->data.push_back(v ? 0x80 : 0x00);
    this->last_byte_unset_bits = 7;
  }
}